

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::
genShaderSourceInterpolateAt_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,NegativeTestContext *ctx,
          ShaderType shaderType,ShaderFunction function,DataType interpolantDataType,
          DataType secondArgumentDataType)

{
  bool bVar1;
  ContextType ctxType;
  char *pcVar2;
  ostream *poVar3;
  ostream *poVar4;
  ShaderType shaderType_00;
  string *this_00;
  allocator<char> local_40e;
  allocator<char> local_40d;
  DataType local_40c;
  string *local_408;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380 [32];
  string local_360 [32];
  string local_340;
  ostream local_320;
  ostringstream source;
  
  shaderType_00 = shaderType;
  local_40c = interpolantDataType;
  local_408 = __return_storage_ptr__;
  ctxType.super_ApiType.m_bits = (ApiType)(**(code **)(**(long **)(this + 0x20) + 0x10))();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&source);
  pcVar2 = glu::getGLSLVersionDeclaration(bVar1 | GLSL_VERSION_310_ES);
  poVar3 = std::operator<<(&source.super_basic_ostream<char,_std::char_traits<char>_>,pcVar2);
  poVar3 = std::operator<<(poVar3,"\n");
  getShaderInitialization_abi_cxx11_
            (&local_400,this,(NegativeTestContext *)((ulong)ctx & 0xffffffff),shaderType_00);
  poVar3 = std::operator<<(poVar3,(string *)&local_400);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3e0,glcts::fixed_sample_locations_values + 1,&local_40e);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_340,"GL_OES_shader_multisample_interpolation",&local_40e);
    NegativeTestShared::anon_unknown_0::getShaderExtensionDeclaration(&local_3e0,&local_340);
  }
  poVar3 = std::operator<<(poVar3,(string *)&local_3e0);
  std::__cxx11::string::string<std::allocator<char>>(local_380,"interpolant",&local_40d);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_320);
  poVar4 = std::operator<<(&local_320,"in ");
  pcVar2 = glu::getPrecisionName(PRECISION_HIGHP);
  poVar4 = std::operator<<(poVar4,pcVar2);
  poVar4 = std::operator<<(poVar4," ");
  pcVar2 = glu::getDataTypeName(function);
  poVar4 = std::operator<<(poVar4,pcVar2);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = std::operator<<(poVar4,local_380);
  std::operator<<(poVar4,";\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_320);
  poVar3 = std::operator<<(poVar3,local_360);
  poVar3 = std::operator<<(poVar3,"void main()\n");
  std::operator<<(poVar3,"{\n");
  std::__cxx11::string::~string(local_360);
  std::__cxx11::string::~string(local_380);
  std::__cxx11::string::~string((string *)&local_3e0);
  if (!bVar1) {
    std::__cxx11::string::~string((string *)&local_340);
  }
  std::__cxx11::string::~string((string *)&local_400);
  if (shaderType == 0x18) {
    std::operator<<(&source.super_basic_ostream<char,_std::char_traits<char>_>,
                    "    interpolateAtCentroid(interpolant);\n");
  }
  else {
    if (shaderType == 0x19) {
      poVar3 = std::operator<<(&source.super_basic_ostream<char,_std::char_traits<char>_>,
                               "\tmediump ");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3a0,"sample",(allocator<char> *)&local_400);
      NegativeTestShared::anon_unknown_0::declareAndInitializeShaderVariable
                ((string *)&local_320,local_40c,&local_3a0);
      poVar3 = std::operator<<(poVar3,(string *)&local_320);
      std::operator<<(poVar3,"    interpolateAtSample(interpolant, sample);\n");
      std::__cxx11::string::~string((string *)&local_320);
      this_00 = &local_3a0;
    }
    else {
      poVar3 = std::operator<<(&source.super_basic_ostream<char,_std::char_traits<char>_>,
                               "\tmediump ");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3c0,"offset",(allocator<char> *)&local_400);
      NegativeTestShared::anon_unknown_0::declareAndInitializeShaderVariable
                ((string *)&local_320,local_40c,&local_3c0);
      poVar3 = std::operator<<(poVar3,(string *)&local_320);
      std::operator<<(poVar3,"    interpolateAtOffset(interpolant, offset);\n");
      std::__cxx11::string::~string((string *)&local_320);
      this_00 = &local_3c0;
    }
    std::__cxx11::string::~string((string *)this_00);
  }
  std::operator<<(&source.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&source);
  return local_408;
}

Assistant:

std::string genShaderSourceInterpolateAt (NegativeTestContext& ctx, glu::ShaderType shaderType, ShaderFunction function, glu::DataType interpolantDataType, glu::DataType secondArgumentDataType)
{
	DE_ASSERT(function >= SHADER_FUNCTION_INTERPOLATED_AT_CENTROID && function <= SHADER_FUNCTION_INTERPOLATED_AT_OFFSET);

	const bool			supportsES32 = contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2));
	std::ostringstream	source;

	source	<< (supportsES32 ? glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_320_ES) : glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES)) << "\n"
			<< getShaderInitialization(ctx, shaderType)
			<< (supportsES32 ? "" : getShaderExtensionDeclaration("GL_OES_shader_multisample_interpolation"))
			<< declareShaderInput(interpolantDataType, "interpolant")
			<< "void main()\n"
			<< "{\n";

	switch (function)
	{
		case SHADER_FUNCTION_INTERPOLATED_AT_CENTROID:
			source << "    interpolateAtCentroid(interpolant);\n";
			break;

		case SHADER_FUNCTION_INTERPOLATED_AT_SAMPLE:
			source	<< "	mediump " << declareAndInitializeShaderVariable(secondArgumentDataType, "sample")
					<< "    interpolateAtSample(interpolant, sample);\n";
			break;

		case SHADER_FUNCTION_INTERPOLATED_AT_OFFSET:
			source	<< "	mediump " << declareAndInitializeShaderVariable(secondArgumentDataType, "offset")
					<< "    interpolateAtOffset(interpolant, offset);\n";
			break;

		default:
			DE_FATAL("Unsupported shader function.");
	}

	source << "}\n";

	return source.str();
}